

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void assessColPrimalSolution
               (HighsOptions *options,double primal,double lower,double upper,HighsVarType type,
               double *col_infeasibility,double *integer_infeasibility)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  double *in_RCX;
  double *in_RDX;
  char in_SIL;
  long in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  dVar1 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  *in_RDX = 0.0;
  if (in_XMM1_Qa - *(double *)(in_RDI + 0x118) <= dVar1) {
    if (in_XMM2_Qa + *(double *)(in_RDI + 0x118) < dVar1) {
      *in_RDX = dVar1 - in_XMM2_Qa;
    }
  }
  else {
    *in_RDX = in_XMM1_Qa - dVar1;
  }
  *in_RCX = 0.0;
  if ((in_SIL == '\x01') || (in_SIL == '\x03')) {
    dVar2 = fractionality<double>((double)in_RDX,in_RCX);
    *in_RCX = dVar2;
  }
  if ((0.0 < *in_RDX) && ((in_SIL == '\x02' || (in_SIL == '\x03')))) {
    if (ABS(dVar1) <= *(double *)(in_RDI + 0x328)) {
      *in_RDX = 0.0;
    }
    if (((*in_RDX != 0.0) || (NAN(*in_RDX))) && (dVar1 < in_XMM2_Qa)) {
      pdVar3 = std::max<double>(in_RDX,in_RCX);
      *in_RCX = *pdVar3;
    }
  }
  return;
}

Assistant:

void assessColPrimalSolution(const HighsOptions& options, const double primal,
                             const double lower, const double upper,
                             const HighsVarType type, double& col_infeasibility,
                             double& integer_infeasibility) {
  // @primal_infeasibility calculation
  col_infeasibility = 0;
  if (primal < lower - options.primal_feasibility_tolerance) {
    col_infeasibility = lower - primal;
  } else if (primal > upper + options.primal_feasibility_tolerance) {
    col_infeasibility = primal - upper;
  }
  integer_infeasibility = 0;
  if (type == HighsVarType::kInteger || type == HighsVarType::kSemiInteger) {
    integer_infeasibility = fractionality(primal);
  }
  if (col_infeasibility > 0 && (type == HighsVarType::kSemiContinuous ||
                                type == HighsVarType::kSemiInteger)) {
    // Semi-variables at zero will have positive col
    // infeasibility, so possibly zero this
    if (std::fabs(primal) <= options.mip_feasibility_tolerance)
      col_infeasibility = 0;
    // If there is (still) column infeasibility due to value being
    // off zero or below lower bound, then this counts as an integer
    // infeasibility
    if (col_infeasibility && primal < upper)
      integer_infeasibility =
          std::max(col_infeasibility, integer_infeasibility);
  }
}